

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
          (LayerNormalizationLayerParams *this)

{
  WeightParams *this_00;
  LayerNormalizationLayerParams *this_local;
  
  if (this->gamma_ == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->gamma_ = this_00;
  }
  return this->gamma_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* LayerNormalizationLayerParams::mutable_gamma() {
  
  if (gamma_ == NULL) {
    gamma_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LayerNormalizationLayerParams.gamma)
  return gamma_;
}